

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::Num3(ByteCodeWriter *this,OpCode op,RegSlot C0,RegSlot C1,RegSlot C2)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegSlot local_40;
  RegSlot local_3c;
  RegSlot local_38;
  RegSlot local_34;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x4);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    local_34 = C2;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x99f,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    C2 = local_34;
  }
  bVar2 = TryWriteReg3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,op,C0,C1,C2);
  if (!bVar2) {
    bVar2 = TryWriteReg3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,op,C0,C1,C2);
    if (!bVar2) {
      local_40 = C0;
      local_3c = C1;
      local_38 = C2;
      Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,op,this);
      Data::Write(&this->m_byteCodeData,&local_40,0xc);
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::Num3(OpCode op, RegSlot C0, RegSlot C1, RegSlot C2)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg3);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        MULTISIZE_LAYOUT_WRITE(Reg3, op, C0, C1, C2);
    }